

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_p.h
# Opt level: O2

uint8_t * chunkcopy_safe(uint8_t *out,uint8_t *from,uint64_t len,uint8_t *safe)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t uVar3;
  undefined8 uVar4;
  ulong uVar5;
  ulong __n;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint8_t *puVar10;
  long lVar11;
  bool bVar12;
  
  __n = (long)safe - (long)out;
  if (len <= (ulong)((long)safe - (long)out)) {
    __n = len;
  }
  uVar5 = (long)from - (long)out;
  puVar10 = out + __n;
  if ((from < out || puVar10 <= from) && (out < from || from + __n <= out)) {
    memcpy(out,from,__n);
  }
  else {
    uVar8 = (long)out - (long)from;
    if (uVar8 != 0) {
      uVar6 = -uVar5;
      if (0 < (long)uVar5) {
        uVar6 = uVar5;
      }
      puVar10 = out;
      if ((long)uVar5 < (long)uVar8) {
        uVar5 = uVar8;
      }
      while (__n != 0) {
        uVar8 = __n;
        if (uVar6 < __n) {
          uVar8 = uVar6;
        }
        uVar9 = uVar5;
        if (__n < uVar5) {
          uVar9 = __n;
        }
        lVar11 = 0;
        lVar7 = 0;
        while( true ) {
          puVar1 = from + lVar7;
          puVar2 = puVar10 + lVar7;
          if (uVar9 + lVar11 < 0x10) break;
          uVar4 = *(undefined8 *)(puVar1 + 8);
          *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
          *(undefined8 *)(puVar2 + 8) = uVar4;
          lVar7 = lVar7 + 0x10;
          lVar11 = lVar11 + -0x10;
        }
        uVar9 = uVar5;
        if (__n < uVar5) {
          uVar9 = __n;
        }
        uVar9 = uVar9 + lVar11;
        if (7 < uVar9) {
          *(undefined8 *)(puVar10 + lVar7) = *(undefined8 *)(from + lVar7);
          uVar9 = uVar5;
          if (__n < uVar5) {
            uVar9 = __n;
          }
          uVar9 = (uVar9 - lVar7) - 8;
          puVar1 = from + lVar7 + 8;
          puVar2 = puVar10 + lVar7 + 8;
        }
        puVar10 = puVar2;
        from = puVar1;
        if (3 < uVar9) {
          *(undefined4 *)puVar10 = *(undefined4 *)from;
          puVar10 = puVar10 + 4;
          from = from + 4;
          uVar9 = uVar9 - 4;
        }
        __n = __n - uVar8;
        while (bVar12 = uVar9 != 0, uVar9 = uVar9 - 1, bVar12) {
          uVar3 = *from;
          from = from + 1;
          *puVar10 = uVar3;
          puVar10 = puVar10 + 1;
        }
      }
    }
  }
  return puVar10;
}

Assistant:

static inline uint8_t* chunkcopy_safe(uint8_t *out, uint8_t *from, uint64_t len, uint8_t *safe) {
    uint64_t safelen = safe - out;
    len = MIN(len, safelen);
    int32_t olap_src = from >= out && from < out + len;
    int32_t olap_dst = out >= from && out < from + len;
    uint64_t tocopy;

    /* For all cases without overlap, memcpy is ideal */
    if (!(olap_src || olap_dst)) {
        memcpy(out, from, (size_t)len);
        return out + len;
    }

    /* Complete overlap: Source == destination */
    if (out == from) {
        return out + len;
    }

    /* We are emulating a self-modifying copy loop here. To do this in a way that doesn't produce undefined behavior,
     * we have to get a bit clever. First if the overlap is such that src falls between dst and dst+len, we can do the
     * initial bulk memcpy of the nonoverlapping region. Then, we can leverage the size of this to determine the safest
     * atomic memcpy size we can pick such that we have non-overlapping regions. This effectively becomes a safe look
     * behind or lookahead distance. */
    uint64_t non_olap_size = llabs(from - out); // llabs vs labs for compatibility with windows

    /* So this doesn't give use a worst case scenario of function calls in a loop,
     * we want to instead break this down into copy blocks of fixed lengths
     *
     * TODO: The memcpy calls aren't inlined on architectures with strict memory alignment
     */
    while (len) {
        tocopy = MIN(non_olap_size, len);
        len -= tocopy;

        while (tocopy >= 16) {
            memcpy(out, from, 16);
            out += 16;
            from += 16;
            tocopy -= 16;
        }

        if (tocopy >= 8) {
            memcpy(out, from, 8);
            out += 8;
            from += 8;
            tocopy -= 8;
        }

        if (tocopy >= 4) {
            memcpy(out, from, 4);
            out += 4;
            from += 4;
            tocopy -= 4;
        }

        while (tocopy--) {
            *out++ = *from++;
        }
    }

    return out;
}